

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

basic_string<char,_eastl::allocator> * __thiscall
eastl::basic_string<char,_eastl::allocator>::assign
          (basic_string<char,_eastl::allocator> *this,value_type *pBegin,value_type *pEnd)

{
  size_t __n;
  ptrdiff_t n;
  value_type *pEnd_local;
  value_type *pBegin_local;
  basic_string<char,_eastl::allocator> *this_local;
  
  __n = (long)pEnd - (long)pBegin;
  if ((uint)((int)this->mpEnd - (int)this->mpBegin) < (uint)__n) {
    memmove(this->mpBegin,pBegin,(long)this->mpEnd - (long)this->mpBegin);
    append(this,pBegin + (uint)((int)this->mpEnd - (int)this->mpBegin),pEnd);
  }
  else {
    memmove(this->mpBegin,pBegin,__n);
    erase(this,this->mpBegin + __n,this->mpEnd);
  }
  return this;
}

Assistant:

basic_string<T, Allocator>& basic_string<T, Allocator>::assign(const value_type* pBegin, const value_type* pEnd)
    {
        const ptrdiff_t n = pEnd - pBegin;
        if(static_cast<size_type>(n) <= (size_type)(mpEnd - mpBegin))
        {
            memmove(mpBegin, pBegin, (size_t)n * sizeof(value_type));
            erase(mpBegin + n, mpEnd);
        }
        else
        {
            memmove(mpBegin, pBegin, (size_t)(mpEnd - mpBegin) * sizeof(value_type));
            append(pBegin + (size_type)(mpEnd - mpBegin), pEnd);
        }
        return *this;
    }